

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSession::SetDefaultPayloadType(RTPSession *this,uint8_t pt)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if ((this->created == true) && (iVar1 = -0x14, (this->packetbuilder).init == true)) {
    (this->packetbuilder).defptset = true;
    (this->packetbuilder).defaultpayloadtype = pt;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultPayloadType(uint8_t pt)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;
	
	int status;
	
	BUILDER_LOCK
	status = packetbuilder.SetDefaultPayloadType(pt);
	BUILDER_UNLOCK
	return status;
}